

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O1

SharedPtr<Decorator> __thiscall
Rml::DecoratorLinearGradientInstancer::InstanceDecorator
          (DecoratorLinearGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  DecoratorLinearGradient *pDVar1;
  int iVar2;
  Property *this_00;
  Property *this_01;
  Property *this_02;
  Property *pPVar3;
  Property *pPVar4;
  NumericValue value;
  undefined8 extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  uint uVar6;
  float fVar7;
  SharedPtr<Decorator> SVar8;
  SharedPtr<Rml::DecoratorLinearGradient> decorator;
  undefined1 local_51;
  DecoratorLinearGradient *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  PropertyDictionary *local_40;
  Property *local_38;
  
  local_40 = properties_;
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
  this_01 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  this_02 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  pPVar3 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xb]);
  pPVar4 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xc]);
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT71((int7)((ulong)extraout_RDX >> 8),
                         (pPVar3 != (Property *)0x0 && this_02 != (Property *)0x0) &&
                         (this_01 != (Property *)0x0 && this_00 != (Property *)0x0));
  if (((pPVar3 != (Property *)0x0 && this_02 != (Property *)0x0) &&
      (this_01 != (Property *)0x0 && this_00 != (Property *)0x0)) && pPVar4 != (Property *)0x0) {
    local_50 = (DecoratorLinearGradient *)((ulong)local_50 & 0xffffffffffffff00);
    local_38 = pPVar3;
    Variant::GetInto<bool,_0>(&this_01->value,(bool *)&local_50);
    if ((char)local_50 == '\x01') {
      local_50 = (DecoratorLinearGradient *)((ulong)local_50 & 0xffffffff00000000);
      Variant::GetInto<int,_0>(&this_02->value,(int *)&local_50);
      uVar6 = (uint)local_50;
      local_50 = (DecoratorLinearGradient *)((ulong)local_50 & 0xffffffff00000000);
      Variant::GetInto<int,_0>(&local_38->value,(int *)&local_50);
      uVar6 = (uVar6 | (uint)local_50) - 1;
      if (uVar6 < 0xc) {
        SVar8.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>)
             (*(code *)(&DAT_002d6c08 + *(int *)(&DAT_002d6c08 + (ulong)uVar6 * 4)))();
        return (SharedPtr<Decorator>)
               SVar8.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
      }
      (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
      (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      _Var5._M_pi = extraout_RDX_00;
    }
    else {
      value = Property::GetNumericValue(this_00);
      fVar7 = ComputeAngle(value);
      if (pPVar4->unit == COLORSTOPLIST) {
        iVar2 = ::std::__cxx11::string::compare((char *)local_40);
        local_50 = (DecoratorLinearGradient *)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Rml::DecoratorLinearGradient,std::allocator<Rml::DecoratorLinearGradient>>
                  (&local_48,&local_50,(allocator<Rml::DecoratorLinearGradient> *)&local_51);
        pDVar1 = local_50;
        local_50->repeating = iVar2 == 0;
        local_50->corner = Count;
        local_50->angle = fVar7;
        ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::operator=
                  (&local_50->color_stops,
                   (vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)(pPVar4->value).data);
        _Var5._M_pi = local_48._M_pi;
        if ((pDVar1->color_stops).
            super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (pDVar1->color_stops).
            super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
          (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        }
        else {
          (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)local_50;
          (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var5._M_pi;
          local_50 = (DecoratorLinearGradient *)0x0;
        }
        _Var5._M_pi = extraout_RDX_02;
        if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
          _Var5._M_pi = extraout_RDX_03;
        }
      }
      else {
        (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
        (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _Var5._M_pi = extraout_RDX_01;
      }
    }
  }
  else {
    (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
    (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  SVar8.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  SVar8.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar8.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorLinearGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	const Property* p_angle = properties_.GetProperty(ids.angle);
	const Property* p_direction_to = properties_.GetProperty(ids.direction_to);
	const Property* p_direction_x = properties_.GetProperty(ids.direction_x);
	const Property* p_direction_y = properties_.GetProperty(ids.direction_y);
	const Property* p_color_stop_list = properties_.GetProperty(ids.color_stop_list);

	if (!p_angle || !p_direction_to || !p_direction_x || !p_direction_y || !p_color_stop_list)
		return nullptr;

	using Corner = DecoratorLinearGradient::Corner;
	Corner corner = Corner::None;
	float angle = 0.f;

	if (p_direction_to->Get<bool>())
	{
		const Direction direction = (Direction)(p_direction_x->Get<int>() | p_direction_y->Get<int>());
		switch (direction)
		{
		case Direction::Top: angle = 0.f; break;
		case Direction::Right: angle = 0.5f * Math::RMLUI_PI; break;
		case Direction::Bottom: angle = Math::RMLUI_PI; break;
		case Direction::Left: angle = 1.5f * Math::RMLUI_PI; break;
		case Direction::TopLeft: corner = Corner::TopLeft; break;
		case Direction::TopRight: corner = Corner::TopRight; break;
		case Direction::BottomRight: corner = Corner::BottomRight; break;
		case Direction::BottomLeft: corner = Corner::BottomLeft; break;
		case Direction::None:
		default: return nullptr; break;
		}
	}
	else
	{
		angle = ComputeAngle(p_angle->GetNumericValue());
	}

	if (p_color_stop_list->unit != Unit::COLORSTOPLIST)
		return nullptr;
	const ColorStopList& color_stop_list = p_color_stop_list->value.GetReference<ColorStopList>();
	const bool repeating = (name == "repeating-linear-gradient");

	auto decorator = MakeShared<DecoratorLinearGradient>();
	if (decorator->Initialise(repeating, corner, angle, color_stop_list))
		return decorator;

	return nullptr;
}